

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::MenuItemEx(char *label,char *icon,char *shortcut,bool selected,bool enabled)

{
  ImGuiWindow *pIVar1;
  ImDrawList *draw_list;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  undefined4 w_label;
  bool bVar4;
  bool bVar5;
  ImU32 col;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImVec2 local_b8;
  ImVec2 local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImGuiWindow *local_70;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    fVar8 = (pIVar1->DC).CursorPos.x;
    local_48 = ZEXT416((uint)(pIVar1->DC).CursorPos.y);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uStack_80 = extraout_XMM0_Dc;
    local_88._0_4_ = IVar2.x;
    local_88._4_4_ = IVar2.y;
    uStack_7c = extraout_XMM0_Dd;
    bVar4 = IsRootOfOpenMenuSet();
    local_70 = pIVar3->NavWindow;
    if (bVar4) {
      pIVar3->NavWindow = pIVar1;
    }
    PushID(label);
    if (!enabled) {
      BeginDisabled(true);
    }
    if ((pIVar1->DC).LayoutType == 0) {
      local_a0.x = (pIVar3->Style).ItemSpacing.x;
      fVar8 = (float)(int)(local_a0.x * 0.5) + (pIVar1->DC).CursorPos.x;
      (pIVar1->DC).CursorPos.x = fVar8;
      IVar2.y = (pIVar1->DC).CursorPos.y + (pIVar1->DC).CurrLineTextBaseOffset;
      IVar2.x = (float)(pIVar1->DC).MenuColumns.OffsetLabel + fVar8;
      local_a0.x = local_a0.x + local_a0.x;
      local_a0.y = (pIVar3->Style).ItemSpacing.y;
      PushStyleVar(0xe,&local_a0);
      local_a0.x = (float)local_88._0_4_;
      local_a0.y = 0.0;
      bVar5 = Selectable("",selected,0x4800000,&local_a0);
      PopStyleVar(1);
      RenderText(IVar2,label,(char *)0x0,true);
      (pIVar1->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (pIVar1->DC).CursorPos.x;
    }
    else {
      local_58 = 0.0;
      fStack_54 = 0.0;
      uStack_50 = 0;
      uStack_4c = 0;
      if ((icon != (char *)0x0) && (*icon != '\0')) {
        IVar2 = CalcTextSize(icon,(char *)0x0,false,-1.0);
        local_58 = IVar2.x;
        fStack_54 = IVar2.y;
        uStack_50 = extraout_XMM0_Dc_00;
        uStack_4c = extraout_XMM0_Dd_00;
      }
      uVar10 = 0;
      uVar9 = 0;
      fVar7 = 0.0;
      fVar6 = 0.0;
      if ((shortcut != (char *)0x0) && (*shortcut != '\0')) {
        IVar2 = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
        fVar6 = IVar2.x;
        fVar7 = IVar2.y;
        uVar9 = extraout_XMM0_Dc_01;
        uVar10 = extraout_XMM0_Dd_01;
      }
      w_label = local_88._0_4_;
      local_88._4_4_ = fVar7;
      local_88._0_4_ = fVar6;
      uStack_80 = uVar9;
      uStack_7c = uVar10;
      local_98 = ImGuiMenuColumns::DeclColumns
                           (&(pIVar1->DC).MenuColumns,local_58,(float)w_label,fVar6,
                            (float)(int)(pIVar3->FontSize * 1.2));
      IVar2 = GetContentRegionAvail();
      fVar6 = IVar2.x - local_98;
      local_68 = ZEXT416(~-(uint)(fVar6 <= 0.0) & (uint)fVar6);
      local_a0.x = local_98;
      local_a0.y = 0.0;
      bVar5 = Selectable("",false,0x5800000,&local_a0);
      local_98 = (float)local_48._0_4_ + 0.0;
      uStack_94 = local_48._4_4_;
      uStack_90 = local_48._8_4_;
      uStack_8c = local_48._12_4_;
      pos.y = local_98;
      pos.x = (float)(pIVar1->DC).MenuColumns.OffsetLabel + fVar8;
      RenderText(pos,label,(char *)0x0,true);
      if (0.0 < local_58) {
        pos_00.y = local_98;
        pos_00.x = (float)(pIVar1->DC).MenuColumns.OffsetIcon + fVar8;
        RenderText(pos_00,icon,(char *)0x0,true);
      }
      if (0.0 < (float)local_88._0_4_) {
        PushStyleColor(0,(pIVar3->Style).Colors + 1);
        pos_01.y = local_98;
        pos_01.x = (float)(pIVar1->DC).MenuColumns.OffsetShortcut + (float)local_68._0_4_ + fVar8;
        RenderText(pos_01,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        draw_list = pIVar1->DrawList;
        local_b8.y = (float)local_48._0_4_ + pIVar3->FontSize * 0.134 * 0.5;
        local_b8.x = fVar8 + pIVar3->FontSize * 0.4 +
                             (float)local_68._0_4_ + (float)(pIVar1->DC).MenuColumns.OffsetMark;
        col = GetColorU32(0,1.0);
        RenderCheckMark(draw_list,local_b8,col,pIVar3->FontSize * 0.866);
      }
    }
    if (!enabled) {
      EndDisabled();
    }
    PopID();
    if (bVar4) {
      pIVar3->NavWindow = local_70;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}